

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

void cft_fasttext_save_vectors(fasttext_t *handle,char *filename,char **errptr)

{
  char *in_RSI;
  invalid_argument *e;
  string *in_stack_00000268;
  FastText *in_stack_00000270;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  fasttext::FastText::saveVectors(in_stack_00000270,in_stack_00000268);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void cft_fasttext_save_vectors(fasttext_t* handle, const char* filename, char** errptr) {
    try {
        ((FastText*)handle)->saveVectors(filename);
    } catch (const std::invalid_argument& e) {
        save_error(errptr, e);
    }
}